

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O1

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::PrintArchiveContent
          (ArchiverFactoryImpl *this,IDataBlob *pArchive)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  long lVar1;
  string _msg;
  DeviceObjectArchive ObjArchive;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  DeviceObjectArchive local_f8;
  
  local_138._8_4_ = 0xffffffff;
  local_138[0xc] = false;
  local_138._0_8_ = pArchive;
  DeviceObjectArchive::DeviceObjectArchive(&local_f8,(CreateInfo *)local_138);
  DeviceObjectArchive::ToString_abi_cxx11_(&local_118,&local_f8);
  FormatString<std::__cxx11::string>((string *)local_138,(Diligent *)&local_118,Args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_138._0_8_,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  if (local_f8.m_pArchiveData.m_pObject != (IDataBlob *)0x0) {
    (*((local_f8.m_pArchiveData.m_pObject)->super_IObject)._vptr_IObject[2])();
    local_f8.m_pArchiveData.m_pObject = (IDataBlob *)0x0;
  }
  lVar1 = 200;
  do {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
              ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
               ((long)local_f8.m_DeviceShaders._M_elems + lVar1 + -0x38));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x20);
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_f8);
  return true;
}

Assistant:

Bool ArchiverFactoryImpl::PrintArchiveContent(const IDataBlob* pArchive) const
{
    try
    {
        DeviceObjectArchive ObjArchive{DeviceObjectArchive::CreateInfo{pArchive}};

        LOG_INFO_MESSAGE(ObjArchive.ToString());
        return true;
    }
    catch (...)
    {
        return false;
    }
}